

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O2

Acb_Ntk_t *
Acb_NtkFromNdr(char *pFileName,void *pModule,Abc_Nam_t *pNames,Vec_Int_t *vWeights,int nNameIdMax)

{
  int *piVar1;
  Vec_Int_t *p;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Acb_ObjType_t Type;
  uint uVar6;
  Abc_Nam_t *pAVar7;
  Acb_Ntk_t *pNtk;
  Vec_Int_t *p_00;
  int **ppiVar8;
  Abc_Nam_t *pStrs;
  int Count_2;
  undefined4 in_register_00000084;
  Abc_Nam_t *pMods;
  Hash_IntMan_t *in_R9;
  int Count;
  int iVar9;
  ulong uVar10;
  int Obj;
  int iVar11;
  int nCos;
  int Obj_1;
  int *pArray;
  int local_44;
  Acb_Man_t *local_40;
  Vec_Int_t *local_38;
  
  pMods = (Abc_Nam_t *)CONCAT44(in_register_00000084,nNameIdMax);
  local_38 = vWeights;
  pAVar7 = Abc_NamRef(pNames);
  local_40 = Acb_ManAlloc(pFileName,(int)pAVar7,pStrs,(Abc_Nam_t *)vWeights,pMods,in_R9);
  iVar9 = 0;
  iVar2 = Abc_NamStrFindOrAdd(local_40->pStrs,local_40->pName,(int *)0x0);
  iVar11 = 3;
  while( true ) {
    iVar3 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
    if (iVar3 + 2 <= iVar11) break;
    iVar3 = Ndr_DataType((Ndr_Data_t *)pModule,iVar11);
    if (iVar3 == 3) {
      iVar3 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar11,3);
      iVar9 = (iVar9 + 1) - (uint)(iVar3 == 0);
    }
    iVar3 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar11);
    iVar11 = iVar11 + iVar3;
  }
  nCos = 0;
  for (iVar11 = 3; iVar11 < iVar3 + 2; iVar11 = iVar11 + iVar4) {
    iVar3 = Ndr_DataType((Ndr_Data_t *)pModule,iVar11);
    if (iVar3 == 3) {
      iVar3 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar11,4);
      nCos = (nCos + 1) - (uint)(iVar3 == 0);
    }
    iVar4 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar11);
    iVar3 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  }
  iVar4 = 0;
  for (iVar11 = 3; iVar11 < iVar3 + 2; iVar11 = iVar11 + iVar5) {
    iVar3 = Ndr_DataType((Ndr_Data_t *)pModule,iVar11);
    iVar4 = iVar4 + (uint)(iVar3 == 3);
    iVar5 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar11);
    iVar3 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  }
  pNtk = Acb_NtkAlloc(local_40,iVar2,iVar9,nCos,iVar4);
  p_00 = Vec_IntStart(nNameIdMax);
  Vec_IntFill(&pNtk->vObjWeight,(pNtk->vObjType).nCap,0);
  Vec_IntFill(&pNtk->vObjName,(pNtk->vObjType).nCap,0);
  p = local_38;
  iVar2 = 3;
  while( true ) {
    iVar11 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
    iVar9 = iVar11 + 2;
    if (iVar9 <= iVar2) break;
    iVar11 = Ndr_DataType((Ndr_Data_t *)pModule,iVar2);
    if (iVar11 == 3) {
      iVar11 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,3);
      if (iVar11 != 0) {
        iVar11 = Ndr_ObjReadBody((Ndr_Data_t *)pModule,iVar2,5);
        iVar3 = Acb_ObjAlloc(pNtk,ABC_OPER_CI,0,iVar9);
        Vec_IntWriteEntry(p_00,iVar11,iVar3);
        Acb_ObjSetName(pNtk,iVar3,iVar11);
        iVar9 = 1;
        if (p != (Vec_Int_t *)0x0) {
          iVar9 = Vec_IntEntry(p,iVar11);
        }
        Acb_ObjSetWeight(pNtk,iVar3,iVar9);
      }
    }
    iVar9 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar2);
    iVar2 = iVar2 + iVar9;
  }
  for (iVar2 = 3; iVar2 < iVar11 + 2; iVar2 = iVar2 + iVar9) {
    iVar9 = Ndr_DataType((Ndr_Data_t *)pModule,iVar2);
    if (iVar9 == 10) {
      iVar9 = *(int *)(*(long *)((long)pModule + 0x10) + (long)iVar2 * 4);
      iVar11 = Acb_ObjAlloc(pNtk,ABC_OPER_CONST_F,0,iVar2);
      Vec_IntWriteEntry(p_00,iVar9,iVar11);
      Acb_ObjSetName(pNtk,iVar11,iVar9);
      Vec_IntPush(&pNtk->vTargets,iVar11);
    }
    iVar9 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar2);
    iVar11 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  }
  iVar2 = 3;
  while( true ) {
    ppiVar8 = (int **)(ulong)(iVar11 + 2U);
    if ((int)(iVar11 + 2U) <= iVar2) break;
    iVar9 = Ndr_DataType((Ndr_Data_t *)pModule,iVar2);
    if (iVar9 == 3) {
      iVar9 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,3);
      if (iVar9 == 0) {
        iVar9 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,4);
        if (iVar9 == 0) {
          iVar9 = Ndr_ObjReadBody((Ndr_Data_t *)pModule,iVar2,5);
          iVar11 = Ndr_ObjReadArray((Ndr_Data_t *)pModule,iVar2,(int)&pArray,ppiVar8);
          iVar3 = (int)ppiVar8;
          Type = Ndr_ObjReadBody((Ndr_Data_t *)pModule,iVar2,6);
          iVar11 = Acb_ObjAlloc(pNtk,Type,iVar11,iVar3);
          Vec_IntWriteEntry(p_00,iVar9,iVar11);
          Acb_ObjSetName(pNtk,iVar11,iVar9);
        }
      }
    }
    iVar9 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar2);
    iVar2 = iVar2 + iVar9;
    iVar11 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  }
  iVar2 = 3;
  while( true ) {
    ppiVar8 = (int **)(ulong)(iVar11 + 2U);
    if ((int)(iVar11 + 2U) <= iVar2) break;
    iVar9 = Ndr_DataType((Ndr_Data_t *)pModule,iVar2);
    if (iVar9 == 3) {
      iVar9 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,3);
      if (iVar9 == 0) {
        iVar9 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,4);
        if (iVar9 == 0) {
          local_44 = Ndr_ObjReadBody((Ndr_Data_t *)pModule,iVar2,5);
          iVar9 = Vec_IntEntry(p_00,local_44);
          uVar6 = Ndr_ObjReadArray((Ndr_Data_t *)pModule,iVar2,(int)&pArray,ppiVar8);
          piVar1 = pArray;
          if ((int)uVar6 < 1) {
            uVar6 = 0;
          }
          for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
            iVar11 = Vec_IntEntry(p_00,piVar1[uVar10]);
            Acb_ObjAddFanin(pNtk,iVar9,iVar11);
          }
          iVar11 = 1;
          if (local_38 != (Vec_Int_t *)0x0) {
            iVar11 = Vec_IntEntry(local_38,local_44);
          }
          Acb_ObjSetWeight(pNtk,iVar9,iVar11);
        }
      }
    }
    iVar9 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar2);
    iVar2 = iVar2 + iVar9;
    iVar11 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  }
  iVar2 = 3;
  do {
    if (iVar11 + 2 <= iVar2) {
      Vec_IntFree(p_00);
      pNtk->nRegs = 0;
      Acb_NtkAdd(local_40,pNtk);
      return pNtk;
    }
    iVar9 = Ndr_DataType((Ndr_Data_t *)pModule,iVar2);
    if (iVar9 == 3) {
      iVar9 = Ndr_ObjIsType((Ndr_Data_t *)pModule,iVar2,4);
      if (iVar9 != 0) {
        iVar9 = Ndr_ObjReadArray((Ndr_Data_t *)pModule,iVar2,(int)&pArray,ppiVar8);
        if (iVar9 != 1) {
          __assert_fail("nArray == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbAbc.c"
                        ,0xd5,
                        "Acb_Ntk_t *Acb_NtkFromNdr(char *, void *, Abc_Nam_t *, Vec_Int_t *, int)");
        }
        iVar9 = Acb_ObjAlloc(pNtk,ABC_OPER_CO,1,(int)ppiVar8);
        piVar1 = pArray;
        iVar11 = Vec_IntEntry(p_00,*pArray);
        Acb_ObjAddFanin(pNtk,iVar9,iVar11);
        Acb_ObjSetName(pNtk,iVar9,*piVar1);
      }
    }
    iVar9 = Ndr_DataSize((Ndr_Data_t *)pModule,iVar2);
    iVar2 = iVar2 + iVar9;
    iVar11 = *(int *)(*(long *)((long)pModule + 0x10) + 8);
  } while( true );
}

Assistant:

Acb_Ntk_t * Acb_NtkFromNdr( char * pFileName, void * pModule, Abc_Nam_t * pNames, Vec_Int_t * vWeights, int nNameIdMax )
{
    Ndr_Data_t * p   = (Ndr_Data_t *)pModule; 
    Acb_Man_t * pMan = Acb_ManAlloc( pFileName, 1, Abc_NamRef(pNames), NULL, NULL, NULL );
    int k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, pMan->pName, NULL );
    int Mod = 2, Obj, Type, nArray, * pArray, ObjId;
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Ndr_DataCiNum(p, Mod), Ndr_DataCoNum(p, Mod), Ndr_DataObjNum(p, Mod) );
    Vec_Int_t * vMap = Vec_IntStart( nNameIdMax );
    Acb_NtkCleanObjWeights( pNtk );
    Acb_NtkCleanObjNames( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachTarget( p, Mod, Obj )
    {
        NameId = Ndr_DataEntry( p, Obj );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CONST_F, 0, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
        Vec_IntPush( &pNtk->vTargets, ObjId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Type   = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        ObjId  = Acb_ObjAlloc( pNtk, (Acb_ObjType_t) Type, nArray, 0 );
        Vec_IntWriteEntry( vMap, NameId, ObjId );
        Acb_ObjSetName( pNtk, ObjId, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        //char * pName;
        NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        //pName = Abc_NamStr( pMan->pStrs, NameId );
        ObjId  = Vec_IntEntry( vMap, NameId );
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( k = 0; k < nArray; k++ )
            Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[k]) );
        Acb_ObjSetWeight( pNtk, ObjId, vWeights ? Vec_IntEntry(vWeights, NameId) : 1 );
    }
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        nArray = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        assert( nArray == 1 );
        ObjId  = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
        Acb_ObjAddFanin( pNtk, ObjId, Vec_IntEntry(vMap, pArray[0]) );
        Acb_ObjSetName( pNtk, ObjId, pArray[0] );
    }
    Vec_IntFree( vMap );
    Acb_NtkSetRegNum( pNtk, 0 );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}